

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpudpv4transmitter.h
# Opt level: O2

void __thiscall
jrtplib::RTPUDPv4TransmissionInfo::~RTPUDPv4TransmissionInfo(RTPUDPv4TransmissionInfo *this)

{
  (this->super_RTPTransmissionInfo)._vptr_RTPTransmissionInfo =
       (_func_int **)&PTR__RTPUDPv4TransmissionInfo_001451c0;
  std::__cxx11::_List_base<unsigned_int,_std::allocator<unsigned_int>_>::_M_clear
            (&(this->localIPlist).super__List_base<unsigned_int,_std::allocator<unsigned_int>_>);
  return;
}

Assistant:

~RTPUDPv4TransmissionInfo()								{ }